

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeT2LoadImm8(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  void *Decoder_00;
  uint16_t *Decoder_01;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint uVar3;
  uint uVar4;
  
  uVar3 = Insn >> 0x10 & 0xf;
  if (uVar3 == 0xf) {
    uVar3 = MCInst_getOpcode(Inst);
    Decoder_00 = (void *)(ulong)uVar3;
    if ((int)uVar3 < 0x965) {
      if (uVar3 == 0x946) {
        uVar4 = 0x947;
      }
      else if (uVar3 == 0x955) {
        uVar4 = 0x956;
      }
      else {
        if (uVar3 != 0x95d) {
          return MCDisassembler_Fail;
        }
        uVar4 = 0x95e;
      }
    }
    else if ((int)uVar3 < 0x9ae) {
      if (uVar3 == 0x965) {
        uVar4 = 0x966;
      }
      else {
        uVar4 = 0x96e;
        if (uVar3 != 0x96d) {
          return MCDisassembler_Fail;
        }
      }
    }
    else if (uVar3 == 0x9ae) {
      uVar4 = 0x9af;
    }
    else {
      if (uVar3 != 0x9b2) {
        return MCDisassembler_Fail;
      }
      uVar4 = 0x9b3;
    }
    MCInst_setOpcode(Inst,uVar4);
    DVar2 = DecodeT2LoadLabel(Inst,Insn,Address_01,Decoder_00);
    return DVar2;
  }
  uVar4 = Insn >> 0xc & 0xf;
  if ((uVar4 != 0xf) || (uVar1 = MCInst_getOpcode(Inst), uVar1 != 0x965)) {
    uVar1 = MCInst_getOpcode(Inst);
    if ((7 < uVar1 - 0x9ab) ||
       (Decoder_01 = (uint16_t *)0x89, Address_00 = extraout_RDX,
       (0x89U >> (uVar1 - 0x9ab & 0x1f) & 1) == 0)) {
      Decoder_01 = GPRDecoderTable;
      MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar4]);
      Address_00 = extraout_RDX_00;
    }
    DVar2 = DecodeT2AddrModeImm8
                      (Inst,uVar3 << 9 | Insn >> 1 & 0x100 | Insn & 0xff,Address_00,Decoder_01);
    if (DVar2 < 4) {
      return *(DecodeStatus *)(&DAT_001cef90 + (ulong)DVar2 * 4);
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeT2LoadImm8(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned U = fieldFromInstruction_4(Insn, 9, 1);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 8);
	imm |= (U << 8);
	imm |= (Rn << 9);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRi8:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRBi8:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRSBi8:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRHi8:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSHi8:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			case ARM_t2PLDi8:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2PLIi8:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRSHi8:
				return MCDisassembler_Fail;
			default:
				break;
		}
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2PLDi8:
		case ARM_t2PLIi8:
		case ARM_t2PLDWi8:
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeT2AddrModeImm8(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}